

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswMan.c
# Opt level: O2

Csw_Man_t * Csw_ManStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fVerbose)

{
  ulong uVar1;
  uint uVar2;
  Csw_Man_t *pCVar3;
  Aig_Man_t *pAVar4;
  int *piVar5;
  Aig_Obj_t **ppAVar6;
  Csw_Cut_t **ppCVar7;
  Aig_MmFixed_t *pAVar8;
  void *pvVar9;
  Aig_Obj_t *pAVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  size_t __size;
  ulong uVar18;
  char *__assertion;
  
  if (nCutsMax < 2) {
    __assertion = "nCutsMax >= 2";
    uVar12 = 0x32;
  }
  else if (nLeafMax < 0x11) {
    pCVar3 = (Csw_Man_t *)calloc(1,0xa8);
    pCVar3->nCutsMax = nCutsMax;
    pCVar3->nLeafMax = nLeafMax;
    pCVar3->fVerbose = fVerbose;
    pCVar3->pManAig = pMan;
    pAVar4 = Aig_ManStartFrom(pMan);
    pCVar3->pManRes = pAVar4;
    if (pMan->nObjs[2] == pAVar4->nObjs[2]) {
      lVar17 = (long)pMan->vObjs->nSize;
      piVar5 = (int *)calloc(1,lVar17 * 4);
      pCVar3->pnRefs = piVar5;
      __size = lVar17 << 3;
      ppAVar6 = (Aig_Obj_t **)malloc(__size);
      pCVar3->pEquiv = ppAVar6;
      ppCVar7 = (Csw_Cut_t **)calloc(1,__size);
      pCVar3->pCuts = ppCVar7;
      uVar15 = (ulong)(uint)(1 << ((char)nLeafMax - 5U & 0x1f));
      if (nLeafMax < 6) {
        uVar15 = 1;
      }
      iVar14 = (int)uVar15;
      pCVar3->nTruthWords = iVar14;
      iVar16 = (nLeafMax + iVar14) * 4 + 0x18;
      pCVar3->nCutSize = iVar16;
      pAVar8 = Aig_MmFixedStart(iVar16 * nCutsMax,0x200);
      pCVar3->pMemCuts = pAVar8;
      uVar12 = ((pMan->nObjs[6] + pMan->nObjs[5]) * nCutsMax) / 2 - 1;
      do {
        do {
          uVar13 = uVar12 + 1;
          uVar2 = uVar12 & 1;
          uVar12 = uVar13;
        } while (uVar2 != 0);
        uVar18 = 3;
        do {
          iVar16 = (int)uVar18;
          if (uVar13 < (uint)(iVar16 * iVar16)) {
            pCVar3->nTableSize = uVar13;
            ppCVar7 = (Csw_Cut_t **)calloc(1,(long)(int)uVar13 << 3);
            pCVar3->pTable = ppCVar7;
            ppAVar6[pMan->pConst1->Id] = pAVar4->pConst1;
            for (iVar16 = 0; iVar16 < pMan->vCis->nSize; iVar16 = iVar16 + 1) {
              pvVar9 = Vec_PtrEntry(pMan->vCis,iVar16);
              pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pAVar4->vCis,iVar16);
              ppAVar6[*(int *)((long)pvVar9 + 0x24)] = pAVar10;
            }
            puVar11 = (uint *)malloc((ulong)(uint)(iVar14 * 4) << 2);
            pCVar3->puTemp[0] = puVar11;
            puVar11 = puVar11 + uVar15;
            pCVar3->puTemp[1] = puVar11;
            pCVar3->puTemp[2] = puVar11 + uVar15;
            pCVar3->puTemp[3] = puVar11 + uVar15 + uVar15;
            return pCVar3;
          }
          uVar1 = (ulong)uVar13 % uVar18;
          uVar18 = (ulong)(iVar16 + 2);
        } while ((int)uVar1 != 0);
      } while( true );
    }
    __assertion = "Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes)";
    uVar12 = 0x3d;
  }
  else {
    __assertion = "nLeafMax <= 16";
    uVar12 = 0x33;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                ,uVar12,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Csw_Man_t * Csw_ManStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Csw_Man_t, 1 );
    memset( p, 0, sizeof(Csw_Man_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fVerbose = fVerbose;
    p->pManAig  = pMan;
    // create the new manager
    p->pManRes  = Aig_ManStartFrom( pMan );
    assert( Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes) );
    // allocate room for cuts and equivalent nodes
    p->pnRefs   = ABC_ALLOC( int, Aig_ManObjNumMax(pMan) );
    p->pEquiv   = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pMan) );
    p->pCuts    = ABC_ALLOC( Csw_Cut_t *, Aig_ManObjNumMax(pMan) );
    memset( p->pCuts, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pMan) );
    memset( p->pnRefs, 0, sizeof(int) * Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Csw_Cut_t) + sizeof(int) * nLeafMax + sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // allocate hash table for cuts
    p->nTableSize = Abc_PrimeCudd( Aig_ManNodeNum(pMan) * p->nCutsMax / 2 );
    p->pTable = ABC_ALLOC( Csw_Cut_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // set the pointers to the available fraig nodes
    Csw_ObjSetEquiv( p, Aig_ManConst1(p->pManAig), Aig_ManConst1(p->pManRes) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Csw_ObjSetEquiv( p, pObj, Aig_ManCi(p->pManRes, i) );
    // room for temporary truth tables
    p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
    p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
    p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
    p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    return p;
}